

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O1

pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*> __thiscall
QTriangulator<unsigned_short>::ComplexToSimple::outerBounds(ComplexToSimple *this,QPodPoint *point)

{
  int iVar1;
  Edge *pEVar2;
  QPodPoint *pQVar3;
  Node *pNVar4;
  Node *pNVar5;
  Node *pNVar6;
  long lVar7;
  Node *pNVar8;
  long lVar9;
  bool bVar10;
  pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*> pVar11;
  
  pNVar5 = (this->m_edgeList).root;
  pEVar2 = (this->m_edges).buffer;
  pNVar6 = (Node *)0x0;
  pNVar4 = (Node *)0x0;
  do {
    if (pNVar5 == (Node *)0x0) {
      pNVar5 = (Node *)0x0;
      break;
    }
    iVar1 = pNVar5->data;
    pQVar3 = (this->m_parent->m_vertices).buffer;
    lVar7 = ((long)point->x - (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x) *
            ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].y -
            (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y);
    lVar9 = ((long)point->y - (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y) *
            ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].x -
            (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x);
    if (lVar9 - lVar7 != 0) {
      pNVar8 = pNVar5;
      if (lVar7 <= lVar9) {
        pNVar4 = pNVar5;
        pNVar8 = pNVar6;
      }
      pNVar6 = pNVar8;
      pNVar5 = (&pNVar5->left)[lVar7 <= lVar9];
    }
  } while (lVar9 - lVar7 != 0);
  if (pNVar5 != (Node *)0x0) {
    pNVar8 = pNVar5->left;
    if (pNVar8 != (Node *)0x0) {
      pEVar2 = (this->m_edges).buffer;
      pQVar3 = (this->m_parent->m_vertices).buffer;
      do {
        iVar1 = pNVar8->data;
        bVar10 = ((long)point->y -
                 (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y) *
                 ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].x -
                 (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x) -
                 ((long)point->x -
                 (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x) *
                 ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].y -
                 (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y) != 0;
        if (bVar10) {
          pNVar4 = pNVar8;
        }
        pNVar8 = (&pNVar8->left)[bVar10];
      } while (pNVar8 != (Node *)0x0);
    }
    pNVar5 = pNVar5->right;
    if (pNVar5 != (Node *)0x0) {
      pEVar2 = (this->m_edges).buffer;
      pQVar3 = (this->m_parent->m_vertices).buffer;
      do {
        iVar1 = pNVar5->data;
        bVar10 = ((long)point->y -
                 (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y) *
                 ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].x -
                 (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x) -
                 ((long)point->x -
                 (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x) *
                 ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].y -
                 (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y) == 0;
        if (!bVar10) {
          pNVar6 = pNVar5;
        }
        pNVar5 = (&pNVar5->left)[bVar10];
      } while (pNVar5 != (Node *)0x0);
    }
  }
  pVar11.second = pNVar6;
  pVar11.first = pNVar4;
  return pVar11;
}

Assistant:

std::pair<QRBTree<int>::Node *, QRBTree<int>::Node *> QTriangulator<T>::ComplexToSimple::outerBounds(const QPodPoint &point) const
{
    QRBTree<int>::Node *current = m_edgeList.root;
    std::pair<QRBTree<int>::Node *, QRBTree<int>::Node *> result(nullptr, nullptr);

    while (current) {
        const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(current->data).lower());
        const QPodPoint &v2 = m_parent->m_vertices.at(m_edges.at(current->data).upper());
        qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(point, v1, v2);
        if (d == 0)
            break;
        if (d < 0) {
            result.second = current;
            current = current->left;
        } else {
            result.first = current;
            current = current->right;
        }
    }

    if (!current)
        return result;

    QRBTree<int>::Node *mid = current;

    current = mid->left;
    while (current) {
        const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(current->data).lower());
        const QPodPoint &v2 = m_parent->m_vertices.at(m_edges.at(current->data).upper());
        qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(point, v1, v2);
        Q_ASSERT(d >= 0);
        if (d == 0) {
            current = current->left;
        } else {
            result.first = current;
            current = current->right;
        }
    }

    current = mid->right;
    while (current) {
        const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(current->data).lower());
        const QPodPoint &v2 = m_parent->m_vertices.at(m_edges.at(current->data).upper());
        qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(point, v1, v2);
        Q_ASSERT(d <= 0);
        if (d == 0) {
            current = current->right;
        } else {
            result.second = current;
            current = current->left;
        }
    }

    return result;
}